

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_len(Context *context,IntrinsicResult partialResult)

{
  long lVar1;
  ValueList list;
  Value val;
  Value local_58;
  Value local_48;
  Value local_38;
  String local_28;
  
  String::String(&local_28,"self");
  Context::GetVar((Context *)&val,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  String::~String(&local_28);
  if (val.type == String) {
    Value::GetString((Value *)&list);
    lVar1 = String::Length((String *)&list);
    local_48.data.number = (double)lVar1;
    local_48.type = Number;
    local_48.noInvoke = false;
    local_48.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_48,true);
    Value::~Value(&local_48);
    String::~String((String *)&list);
  }
  else if (val.type == Map) {
    Value::GetDict((ValueDict *)&list,&val);
    if (list._8_8_ == 0) {
      local_58.data.number = 0.0;
    }
    else {
      local_58.data.number = (double)*(long *)(list._8_8_ + 0x10);
    }
    local_58.type = Number;
    local_58.noInvoke = false;
    local_58.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
    Value::~Value(&local_58);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&list);
  }
  else if (val.type == List) {
    Value::GetList((Value *)&list);
    if (list.ls == (ListStorage<MiniScript::Value> *)0x0) {
      local_38.data.number = 0.0;
    }
    else {
      local_38.data.number =
           (double)(long)((list.ls)->super_SimpleVector<MiniScript::Value>).mQtyItems;
    }
    local_38.type = Number;
    local_38.noInvoke = false;
    local_38.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
    Value::~Value(&local_38);
    List<MiniScript::Value>::release(&list);
  }
  else {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
  }
  Value::~Value(&val);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_len(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			return IntrinsicResult(list.Count());
		} else if (val.type == ValueType::String) {
			String str = val.GetString();
			return IntrinsicResult(str.Length());
		} else if (val.type == ValueType::Map) {
			return IntrinsicResult(val.GetDict().Count());
		}
		return IntrinsicResult::Null;
	}